

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O3

int aom_noise_model_get_grain_parameters
              (aom_noise_model_t *noise_model,aom_film_grain_t *film_grain)

{
  uint16_t uVar1;
  uint uVar2;
  uint uVar3;
  int (*paiVar4) [2];
  int *piVar5;
  undefined1 auVar6 [16];
  aom_noise_state_t *paVar7;
  int c;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  int c_3;
  long lVar14;
  long lVar15;
  double (*padVar16) [2];
  int c_2;
  double dVar17;
  double dVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined8 uVar24;
  double dVar25;
  int *ar_coeffs [3];
  double y_corr [2];
  int (*film_grain_scaling [3]) [2];
  aom_noise_strength_lut_t local_d8;
  aom_noise_strength_lut_t local_c8;
  aom_noise_strength_lut_t local_b8;
  double local_a8;
  aom_noise_state_t *local_a0;
  int *local_98 [3];
  double adStack_80 [3];
  int (*local_68 [4]) [2];
  double local_48;
  undefined8 uStack_40;
  
  if ((noise_model->params).lag < 4) {
    uVar1 = film_grain->random_seed;
    memset(film_grain->scaling_points_y,0,0x280);
    film_grain->random_seed = uVar1;
    film_grain->apply_grain = 1;
    film_grain->update_parameters = 1;
    film_grain->ar_coeff_lag = (noise_model->params).lag;
    iVar8 = aom_noise_strength_solver_fit_piecewise
                      (&noise_model->combined_state[0].strength_solver,0xe,&local_d8);
    if (iVar8 != 0) {
      iVar8 = aom_noise_strength_solver_fit_piecewise
                        (&noise_model->combined_state[1].strength_solver,10,&local_c8);
      padVar16 = local_d8.points;
      if (iVar8 != 0) {
        iVar8 = aom_noise_strength_solver_fit_piecewise
                          (&noise_model->combined_state[2].strength_solver,10,&local_b8);
        auVar6 = _DAT_0051c400;
        if (iVar8 != 0) {
          local_a0 = noise_model->combined_state;
          dVar17 = (double)(1 << ((char)(noise_model->params).bit_depth - 8U & 0x1f));
          dVar21 = 0.0001;
          lVar10 = 0;
          do {
            iVar8 = (&local_d8)[lVar10].num_points;
            if (0 < (long)iVar8) {
              padVar16 = (&local_d8)[lVar10].points;
              lVar15 = 0;
              do {
                auVar23._8_4_ = SUB84(dVar17,0);
                auVar23._0_8_ = dVar17;
                auVar23._12_4_ = (int)((ulong)dVar17 >> 0x20);
                auVar23 = divpd(*(undefined1 (*) [16])((long)*padVar16 + lVar15),auVar23);
                auVar23 = minpd(auVar6,auVar23);
                *(undefined1 (*) [16])((long)*padVar16 + lVar15) = auVar23;
                dVar22 = auVar23._8_8_;
                if (auVar23._8_8_ <= dVar21) {
                  dVar22 = dVar21;
                }
                dVar21 = dVar22;
                lVar15 = lVar15 + 0x10;
              } while ((long)iVar8 * 0x10 != lVar15);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          dVar17 = log2(dVar21);
          dVar17 = floor(dVar17 + 1.0);
          iVar8 = 5;
          if ((int)dVar17 < 5) {
            iVar8 = (int)dVar17;
          }
          iVar9 = 2;
          if (2 < iVar8) {
            iVar9 = iVar8;
          }
          film_grain->scaling_shift = 0xd - iVar9;
          film_grain->num_y_points = local_d8.num_points;
          film_grain->num_cb_points = local_c8.num_points;
          film_grain->num_cr_points = local_b8.num_points;
          local_68[0] = film_grain->scaling_points_y;
          local_68[1] = film_grain->scaling_points_cb;
          local_68[2] = film_grain->scaling_points_cr;
          lVar10 = 0;
          do {
            if (0 < (&local_d8)[lVar10].num_points) {
              paiVar4 = local_68[lVar10];
              pdVar12 = *(&local_d8)[lVar10].points + 1;
              lVar15 = 0;
              do {
                paiVar4[lVar15][0] = (int)((*(double (*) [2])(pdVar12 + -1))[0] + 0.5);
                iVar8 = (int)(*pdVar12 * (double)(1 << (8U - (char)iVar9 & 0x1f)) + 0.5);
                if (0xfe < iVar8) {
                  iVar8 = 0xff;
                }
                if (iVar8 < 1) {
                  iVar8 = 0;
                }
                paiVar4[lVar15][1] = iVar8;
                lVar15 = lVar15 + 1;
                pdVar12 = pdVar12 + 2;
              } while (lVar15 < (&local_d8)[lVar10].num_points);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          aom_free(local_d8.points);
          local_d8.points = (double (*) [2])0x0;
          local_d8.num_points = 0;
          local_d8._12_4_ = 0;
          aom_free(local_c8.points);
          local_c8.points = (double (*) [2])0x0;
          local_c8.num_points = 0;
          local_c8._12_4_ = 0;
          aom_free(local_b8.points);
          local_b8.points = (double (*) [2])0x0;
          local_b8.num_points = 0;
          local_b8._12_4_ = 0;
          uVar2 = noise_model->combined_state[0].eqns.n;
          adStack_80[1] = 0.0;
          adStack_80[2] = 0.0;
          dVar17 = 0.0001;
          dVar21 = -0.0001;
          lVar10 = 0;
          local_a8 = 0.0;
          do {
            paVar7 = local_a0;
            if (0 < (int)uVar2) {
              uVar11 = 0;
              do {
                dVar22 = local_a0[lVar10].eqns.x[uVar11];
                if (dVar17 <= dVar22) {
                  dVar17 = dVar22;
                }
                if (dVar22 <= dVar21) {
                  dVar21 = dVar22;
                }
                uVar11 = uVar11 + 1;
              } while (uVar2 != uVar11);
            }
            uVar3 = local_a0[lVar10].strength_solver.eqns.n;
            uVar11 = (ulong)uVar3;
            if ((int)uVar3 < 1) {
              dVar22 = 0.0;
              dVar25 = 0.0;
            }
            else {
              dVar25 = 0.0;
              lVar15 = 0;
              lVar14 = 0;
              dVar22 = 0.0;
              uVar24 = 0;
              do {
                dVar18 = 0.0;
                if (0 < (int)uVar11) {
                  uVar13 = 0;
                  do {
                    dVar18 = dVar18 + *(double *)
                                       ((long)paVar7[lVar10].strength_solver.eqns.A +
                                       uVar13 * 8 + lVar15 * (uVar11 & 0xffffffff));
                    uVar13 = uVar13 + 1;
                  } while ((uVar11 & 0xffffffff) != uVar13);
                }
                if (dVar18 < 0.0) {
                  local_48 = dVar22;
                  uStack_40 = uVar24;
                  dVar18 = sqrt(dVar18);
                  dVar22 = local_48;
                  uVar24 = uStack_40;
                }
                else {
                  dVar18 = SQRT(dVar18);
                }
                dVar25 = dVar25 + dVar18;
                dVar22 = dVar22 + dVar18 * paVar7[lVar10].strength_solver.eqns.x[lVar14];
                lVar14 = lVar14 + 1;
                uVar11 = (ulong)paVar7[lVar10].strength_solver.eqns.n;
                lVar15 = lVar15 + 8;
              } while (lVar14 < (long)uVar11);
            }
            dVar22 = (double)(-(ulong)(dVar25 == 0.0) & 0x3ff0000000000000 |
                             ~-(ulong)(dVar25 == 0.0) & (ulong)(dVar22 / dVar25));
            if (lVar10 != 0) {
              dVar25 = (paVar7[lVar10].eqns.x[(int)uVar2] * local_a8) / dVar22;
              adStack_80[lVar10] = dVar25;
              if (dVar17 <= dVar25) {
                dVar17 = dVar25;
              }
              dVar22 = local_a8;
              if (dVar25 <= dVar21) {
                dVar21 = dVar25;
              }
            }
            local_a8 = dVar22;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          dVar22 = log2(dVar17);
          dVar22 = floor(dVar22);
          dVar25 = log2(-dVar21);
          dVar25 = ceil(dVar25);
          if (dVar22 + 1.0 <= dVar25) {
            dVar17 = log2(-dVar21);
            dVar17 = ceil(dVar17);
          }
          else {
            dVar17 = log2(dVar17);
            dVar17 = floor(dVar17);
            dVar17 = dVar17 + 1.0;
          }
          iVar8 = 9;
          if (7 - (int)dVar17 < 9) {
            iVar8 = 7 - (int)dVar17;
          }
          iVar9 = 6;
          if (6 < iVar8) {
            iVar9 = iVar8;
          }
          film_grain->ar_coeff_shift = iVar9;
          dVar17 = (double)(1 << ((byte)iVar9 & 0x1f));
          local_98[0] = film_grain->ar_coeffs_y;
          local_98[1] = film_grain->ar_coeffs_cb;
          local_98[2] = film_grain->ar_coeffs_cr;
          lVar10 = 0;
          do {
            if (0 < (int)uVar2) {
              pdVar12 = local_a0[lVar10].eqns.x;
              piVar5 = local_98[lVar10];
              uVar11 = 0;
              do {
                dVar21 = round(pdVar12[uVar11] * dVar17);
                uVar19 = 0;
                uVar20 = 0xc0600000;
                if (-128.0 <= dVar21) {
                  uVar19 = SUB84(dVar21,0);
                  uVar20 = (undefined4)((ulong)dVar21 >> 0x20);
                }
                dVar21 = 127.0;
                if ((double)CONCAT44(uVar20,uVar19) <= 127.0) {
                  dVar21 = (double)CONCAT44(uVar20,uVar19);
                }
                piVar5[uVar11] = (int)(char)(int)dVar21;
                uVar11 = uVar11 + 1;
              } while (uVar2 != uVar11);
            }
            if (lVar10 != 0) {
              dVar21 = round(adStack_80[lVar10] * dVar17);
              uVar19 = 0;
              uVar20 = 0xc0600000;
              if (-128.0 <= dVar21) {
                uVar19 = SUB84(dVar21,0);
                uVar20 = (undefined4)((ulong)dVar21 >> 0x20);
              }
              dVar21 = 127.0;
              if ((double)CONCAT44(uVar20,uVar19) <= 127.0) {
                dVar21 = (double)CONCAT44(uVar20,uVar19);
              }
              local_98[lVar10][(int)uVar2] = (int)(char)(int)dVar21;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          film_grain->cb_mult = 0x80;
          film_grain->cb_luma_mult = 0xc0;
          film_grain->cb_offset = 0x100;
          film_grain->cr_mult = 0x80;
          film_grain->cr_luma_mult = 0xc0;
          film_grain->cr_offset = 0x100;
          film_grain->chroma_scaling_from_luma = 0;
          film_grain->grain_scale_shift = 0;
          film_grain->overlap_flag = 1;
          return 1;
        }
        aom_free(local_d8.points);
        local_d8.points = (double (*) [2])0x0;
        local_d8.num_points = 0;
        local_d8._12_4_ = 0;
        padVar16 = local_c8.points;
      }
      aom_free(padVar16);
    }
  }
  else {
    fprintf(_stderr,"params.lag = %d > 3\n");
  }
  return 0;
}

Assistant:

int aom_noise_model_get_grain_parameters(aom_noise_model_t *const noise_model,
                                         aom_film_grain_t *film_grain) {
  if (noise_model->params.lag > 3) {
    fprintf(stderr, "params.lag = %d > 3\n", noise_model->params.lag);
    return 0;
  }
  uint16_t random_seed = film_grain->random_seed;
  memset(film_grain, 0, sizeof(*film_grain));
  film_grain->random_seed = random_seed;

  film_grain->apply_grain = 1;
  film_grain->update_parameters = 1;

  film_grain->ar_coeff_lag = noise_model->params.lag;

  // Convert the scaling functions to 8 bit values
  aom_noise_strength_lut_t scaling_points[3];
  if (!aom_noise_strength_solver_fit_piecewise(
          &noise_model->combined_state[0].strength_solver, 14,
          scaling_points + 0)) {
    return 0;
  }
  if (!aom_noise_strength_solver_fit_piecewise(
          &noise_model->combined_state[1].strength_solver, 10,
          scaling_points + 1)) {
    aom_noise_strength_lut_free(scaling_points + 0);
    return 0;
  }
  if (!aom_noise_strength_solver_fit_piecewise(
          &noise_model->combined_state[2].strength_solver, 10,
          scaling_points + 2)) {
    aom_noise_strength_lut_free(scaling_points + 0);
    aom_noise_strength_lut_free(scaling_points + 1);
    return 0;
  }

  // Both the domain and the range of the scaling functions in the film_grain
  // are normalized to 8-bit (e.g., they are implicitly scaled during grain
  // synthesis).
  const double strength_divisor = 1 << (noise_model->params.bit_depth - 8);
  double max_scaling_value = 1e-4;
  for (int c = 0; c < 3; ++c) {
    for (int i = 0; i < scaling_points[c].num_points; ++i) {
      scaling_points[c].points[i][0] =
          AOMMIN(255, scaling_points[c].points[i][0] / strength_divisor);
      scaling_points[c].points[i][1] =
          AOMMIN(255, scaling_points[c].points[i][1] / strength_divisor);
      max_scaling_value =
          AOMMAX(scaling_points[c].points[i][1], max_scaling_value);
    }
  }

  // Scaling_shift values are in the range [8,11]
  const int max_scaling_value_log2 =
      clamp((int)floor(log2(max_scaling_value) + 1), 2, 5);
  film_grain->scaling_shift = 5 + (8 - max_scaling_value_log2);

  const double scale_factor = 1 << (8 - max_scaling_value_log2);
  film_grain->num_y_points = scaling_points[0].num_points;
  film_grain->num_cb_points = scaling_points[1].num_points;
  film_grain->num_cr_points = scaling_points[2].num_points;

  int(*film_grain_scaling[3])[2] = {
    film_grain->scaling_points_y,
    film_grain->scaling_points_cb,
    film_grain->scaling_points_cr,
  };
  for (int c = 0; c < 3; c++) {
    for (int i = 0; i < scaling_points[c].num_points; ++i) {
      film_grain_scaling[c][i][0] = (int)(scaling_points[c].points[i][0] + 0.5);
      film_grain_scaling[c][i][1] = clamp(
          (int)(scale_factor * scaling_points[c].points[i][1] + 0.5), 0, 255);
    }
  }
  aom_noise_strength_lut_free(scaling_points + 0);
  aom_noise_strength_lut_free(scaling_points + 1);
  aom_noise_strength_lut_free(scaling_points + 2);

  // Convert the ar_coeffs into 8-bit values
  const int n_coeff = noise_model->combined_state[0].eqns.n;
  double max_coeff = 1e-4, min_coeff = -1e-4;
  double y_corr[2] = { 0, 0 };
  double avg_luma_strength = 0;
  for (int c = 0; c < 3; c++) {
    aom_equation_system_t *eqns = &noise_model->combined_state[c].eqns;
    for (int i = 0; i < n_coeff; ++i) {
      max_coeff = AOMMAX(max_coeff, eqns->x[i]);
      min_coeff = AOMMIN(min_coeff, eqns->x[i]);
    }
    // Since the correlation between luma/chroma was computed in an already
    // scaled space, we adjust it in the un-scaled space.
    aom_noise_strength_solver_t *solver =
        &noise_model->combined_state[c].strength_solver;
    // Compute a weighted average of the strength for the channel.
    double average_strength = 0, total_weight = 0;
    for (int i = 0; i < solver->eqns.n; ++i) {
      double w = 0;
      for (int j = 0; j < solver->eqns.n; ++j) {
        w += solver->eqns.A[i * solver->eqns.n + j];
      }
      w = sqrt(w);
      average_strength += solver->eqns.x[i] * w;
      total_weight += w;
    }
    if (total_weight == 0)
      average_strength = 1;
    else
      average_strength /= total_weight;
    if (c == 0) {
      avg_luma_strength = average_strength;
    } else {
      y_corr[c - 1] = avg_luma_strength * eqns->x[n_coeff] / average_strength;
      max_coeff = AOMMAX(max_coeff, y_corr[c - 1]);
      min_coeff = AOMMIN(min_coeff, y_corr[c - 1]);
    }
  }
  // Shift value: AR coeffs range (values 6-9)
  // 6: [-2, 2),  7: [-1, 1), 8: [-0.5, 0.5), 9: [-0.25, 0.25)
  film_grain->ar_coeff_shift =
      clamp(7 - (int)AOMMAX(1 + floor(log2(max_coeff)), ceil(log2(-min_coeff))),
            6, 9);
  double scale_ar_coeff = 1 << film_grain->ar_coeff_shift;
  int *ar_coeffs[3] = {
    film_grain->ar_coeffs_y,
    film_grain->ar_coeffs_cb,
    film_grain->ar_coeffs_cr,
  };
  for (int c = 0; c < 3; ++c) {
    aom_equation_system_t *eqns = &noise_model->combined_state[c].eqns;
    for (int i = 0; i < n_coeff; ++i) {
      ar_coeffs[c][i] =
          clamp((int)round(scale_ar_coeff * eqns->x[i]), -128, 127);
    }
    if (c > 0) {
      ar_coeffs[c][n_coeff] =
          clamp((int)round(scale_ar_coeff * y_corr[c - 1]), -128, 127);
    }
  }

  // At the moment, the noise modeling code assumes that the chroma scaling
  // functions are a function of luma.
  film_grain->cb_mult = 128;       // 8 bits
  film_grain->cb_luma_mult = 192;  // 8 bits
  film_grain->cb_offset = 256;     // 9 bits

  film_grain->cr_mult = 128;       // 8 bits
  film_grain->cr_luma_mult = 192;  // 8 bits
  film_grain->cr_offset = 256;     // 9 bits

  film_grain->chroma_scaling_from_luma = 0;
  film_grain->grain_scale_shift = 0;
  film_grain->overlap_flag = 1;
  return 1;
}